

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_GetThreshold(GetThresholdForm1 GetThreshold)

{
  byte bVar1;
  byte bVar2;
  allocator_type local_55;
  value_type_conflict4 local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  
  Unit_Test::intensityArray(&intensity,2);
  while (*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
         intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1]) {
    Unit_Test::intensityArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&histogram,2)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&intensity,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&histogram)
    ;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&histogram);
  }
  local_54 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&histogram,0x100,&local_54,&local_55);
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start
  [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start] =
       histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start
       [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start] + 1;
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start
  [intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start[1]] =
       histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start
       [intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1]] + 1;
  bVar1 = (*GetThreshold)(&histogram);
  bVar2 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[1] <
      *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start) {
    bVar2 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1 == bVar2;
}

Assistant:

bool form1_GetThreshold(GetThresholdForm1 GetThreshold)
    {
        std::vector < uint8_t > intensity = intensityArray( 2 );
        while (intensity[0] == intensity[1])
            intensity = intensityArray( 2 );

        std::vector< uint32_t > histogram( 256u, 0);
        ++histogram[intensity[0]];
        ++histogram[intensity[1]];

        return GetThreshold(histogram) == std::min(intensity[0], intensity[1]);
    }